

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

int Abc_ObjFanoutFaninNum(Abc_Obj_t *pFanout,Abc_Obj_t *pFanin)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if ((pFanout->vFanins).nSize <= lVar1) {
      return -1;
    }
    if ((Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar1]] == pFanin)
    break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int Abc_ObjFanoutFaninNum( Abc_Obj_t * pFanout, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}